

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O0

void __thiscall
pbrt::OrthographicCamera::OrthographicCamera
          (OrthographicCamera *this,CameraBaseParameters *baseParameters,Bounds2f screenWindow,
          Float lensRadius,Float focalDist)

{
  undefined8 uVar1;
  long in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [56];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 in_ZMM1 [64];
  Vector3<float> VVar5;
  Float in_stack_000002d8;
  Float in_stack_000002dc;
  Transform *in_stack_000002e0;
  CameraBaseParameters *in_stack_000002e8;
  ProjectiveCamera *in_stack_000002f0;
  Bounds2f in_stack_000002f8;
  CameraBaseParameters *pCVar6;
  CameraBaseParameters *in_stack_fffffffffffffb50;
  Vector3<float> *this_00;
  undefined8 local_48c;
  undefined4 local_484;
  Vector3<float> local_3f8 [4];
  Transform *in_stack_fffffffffffffc38;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffffc50;
  Float in_stack_fffffffffffffc70;
  Float in_stack_fffffffffffffc74;
  CameraBaseParameters local_378;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_10 = vmovlpd_avx(in_ZMM0._0_16_);
  uStack_8 = vmovlpd_avx(in_ZMM1._0_16_);
  pCVar6 = &local_378;
  CameraBaseParameters::CameraBaseParameters(in_stack_fffffffffffffb50,pCVar6);
  this_00 = local_3f8;
  Orthographic(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70);
  ProjectiveCamera::ProjectiveCamera
            (in_stack_000002f0,in_stack_000002e8,in_stack_000002e0,in_stack_000002f8,
             in_stack_000002dc,in_stack_000002d8);
  Vector3<float>::Vector3((Vector3<float> *)0x8652dd);
  Vector3<float>::Vector3((Vector3<float> *)0x8652ee);
  Vector3<float>::Vector3(this_00,(float)((ulong)pCVar6 >> 0x20),SUB84(pCVar6,0),0.0);
  auVar4 = ZEXT856(0);
  VVar5 = Transform::operator()(in_stack_fffffffffffffc38,in_stack_fffffffffffffc50);
  auVar2._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar4;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  *(float *)(in_RDI + 0x590) = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
  *(undefined8 *)(in_RDI + 0x588) = uVar1;
  Vector3<float>::Vector3(this_00,(float)((ulong)pCVar6 >> 0x20),SUB84(pCVar6,0),0.0);
  auVar4 = ZEXT856(0);
  VVar5 = Transform::operator()(in_stack_fffffffffffffc38,in_stack_fffffffffffffc50);
  auVar3._0_8_ = VVar5.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar4;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  *(undefined8 *)(in_RDI + 0x594) = uVar1;
  *(float *)(in_RDI + 0x59c) = VVar5.super_Tuple3<pbrt::Vector3,_float>.z;
  Vector3<float>::Vector3(this_00,(float)((ulong)pCVar6 >> 0x20),SUB84(pCVar6,0),0.0);
  *(undefined8 *)(in_RDI + 0x374) = local_48c;
  *(undefined4 *)(in_RDI + 0x37c) = local_484;
  *(undefined8 *)(in_RDI + 0x368) = *(undefined8 *)(in_RDI + 0x374);
  *(undefined4 *)(in_RDI + 0x370) = *(undefined4 *)(in_RDI + 0x37c);
  *(undefined8 *)(in_RDI + 0x350) = *(undefined8 *)(in_RDI + 0x588);
  *(undefined4 *)(in_RDI + 0x358) = *(undefined4 *)(in_RDI + 0x590);
  *(undefined8 *)(in_RDI + 0x35c) = *(undefined8 *)(in_RDI + 0x594);
  *(undefined4 *)(in_RDI + 0x364) = *(undefined4 *)(in_RDI + 0x59c);
  return;
}

Assistant:

OrthographicCamera(CameraBaseParameters baseParameters, Bounds2f screenWindow,
                       Float lensRadius, Float focalDist)
        : ProjectiveCamera(baseParameters, Orthographic(0, 1), screenWindow, lensRadius,
                           focalDist) {
        // Compute differential changes in origin for orthographic camera rays
        dxCamera = cameraFromRaster(Vector3f(1, 0, 0));
        dyCamera = cameraFromRaster(Vector3f(0, 1, 0));

        // Compute minimum differentials for orthographic camera
        minDirDifferentialX = minDirDifferentialY = Vector3f(0, 0, 0);
        minPosDifferentialX = dxCamera;
        minPosDifferentialY = dyCamera;
    }